

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDateTime __thiscall QDateTime::addMonths(QDateTime *this,int nmonths)

{
  uint *puVar1;
  Data DVar2;
  QDate date;
  int in_EDX;
  undefined4 in_register_00000034;
  ShortData *other;
  long in_FS_OFFSET;
  pair<QDate,_QTime> pVar3;
  QDate local_40;
  undefined1 *local_38;
  long local_30;
  
  other = (ShortData *)CONCAT44(in_register_00000034,nmonths);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  DVar2.data = *other;
  if (((ulong)DVar2 & 1) == 0) {
    puVar1 = (uint *)((long)DVar2 + 4);
    DVar2._4_4_ = 0;
    DVar2._0_4_ = *puVar1;
  }
  if (((ulong)DVar2.d & 0xe) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QDateTime(this);
      return (QDateTime)(Data)this;
    }
  }
  else {
    (this->d).d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime(this,(QDateTime *)other);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    pVar3 = getDateTime((QDateTimeData *)*other);
    local_40 = pVar3.first.jd;
    local_38 = (undefined1 *)CONCAT44(local_38._4_4_,pVar3.second.mds.mds);
    date = QDate::addMonths(&local_40,in_EDX);
    massageAdjustedDateTime
              (&this->d,date,pVar3.second.mds,(bool)((byte)~(byte)((uint)in_EDX >> 0x18) >> 7));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (QDateTime)(Data)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::addMonths(int nmonths) const
{
    if (isNull())
        return QDateTime();

    QDateTime dt(*this);
    std::pair<QDate, QTime> p = getDateTime(d);
    massageAdjustedDateTime(dt.d, p.first.addMonths(nmonths), p.second, nmonths >= 0);
    return dt;
}